

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-attack-munchkin.c
# Opt level: O2

_Bool borg_munchkin_melee(void)

{
  loc_conflict grid1;
  borg_kill *pbVar1;
  _Bool _Var2;
  wchar_t wVar3;
  char *what;
  int16_t iVar4;
  long lVar5;
  long lVar6;
  
  _Var2 = false;
  if ((((borg.trait[0x19] != 1) && (_Var2 = false, borg.trait[0x19] != 4)) &&
      (_Var2 = false, 0xfd < (byte)(borg_grids[borg.c.y][borg.c.x].feat - 7))) &&
     (borg_kills_cnt != 0)) {
    wVar3 = borg_danger(borg.c.y,borg.c.x,L'\x01',true,true);
    if ((((avoidance * 7) / 10 < wVar3) || (borg.trait[0x1b] < borg.trait[0x1c] / 3)) ||
       (borg.trait[0x72] != 0)) {
LAB_001edd86:
      _Var2 = false;
    }
    else {
      borg_attacking = true;
      borg_temp_n = 0;
      lVar6 = 0x1d8;
      iVar4 = borg_kills_nxt;
      for (lVar5 = 1; pbVar1 = borg_kills, lVar5 < iVar4; lVar5 = lVar5 + 1) {
        if (((*(short *)(borg_kills->spell + lVar6 + -0x19) != 0) &&
            (borg_t + -2 <= (int)*(short *)((long)&borg_kills->when + lVar6))) &&
           (borg.trait[0x69] != 0)) {
          if (scaryguy_on_level != false) goto LAB_001edd86;
          if (((~borg_grids[*(int *)(borg_kills->spell + lVar6 + -9)]
                 [*(int *)(borg_kills->spell + lVar6 + -0xd)].info & 0x28) == 0) &&
             (grid1.y = borg.c.y, grid1.x = borg.c.x,
             wVar3 = distance(grid1,*(loc_conflict *)(borg_kills->spell + lVar6 + -0xd)),
             iVar4 = borg_kills_nxt, wVar3 == L'\x01')) {
            borg_temp_x[borg_temp_n] = pbVar1->spell[lVar6 + -0xd];
            borg_temp_y[borg_temp_n] = pbVar1->spell[lVar6 + -9];
            borg_temp_n = borg_temp_n + 1;
          }
        }
        lVar6 = lVar6 + 0x1d8;
      }
      if (borg_temp_n == 0) {
        _Var2 = false;
      }
      else {
        borg_simulate = true;
        wVar3 = borg_calculate_attack_effectiveness(L'\x01');
        if (wVar3 < L'\x01') {
          _Var2 = false;
        }
        else {
          what = format("# Performing munchkin attack with value %d.",(ulong)(uint)wVar3);
          borg_note(what);
          borg_simulate = false;
          borg_calculate_attack_effectiveness(L'\x01');
          _Var2 = true;
        }
      }
      borg_attacking = false;
    }
  }
  return _Var2;
}

Assistant:

bool borg_munchkin_melee(void)
{
    int i;
    int n = 0;

    borg_grid *ag;

    /* No Mages for now */
    if ((borg.trait[BI_CLASS] == CLASS_MAGE
            || borg.trait[BI_CLASS] == CLASS_NECROMANCER))
        return false;

    /* Must be standing on a stair */
    if (borg_grids[borg.c.y][borg.c.x].feat != FEAT_MORE
        && borg_grids[borg.c.y][borg.c.x].feat != FEAT_LESS)
        return false;

    /* Nobody around */
    if (!borg_kills_cnt)
        return false;

    /* Not if too dangerous */
    if ((borg_danger(borg.c.y, borg.c.x, 1, true, true) > avoidance * 7 / 10)
        || borg.trait[BI_CURHP] < borg.trait[BI_MAXHP] / 3)
        return false;
    if (borg.trait[BI_ISCONFUSED])
        return false;

    /* Set the attacking flag so that danger is boosted for monsters */
    /* we want to attack first. */
    borg_attacking = true;

    /* Reset list */
    borg_temp_n = 0;

    /* Find "nearby" monsters */
    for (i = 1; i < borg_kills_nxt; i++) {
        borg_kill *kill;

        /* Monster */
        kill = &borg_kills[i];

        /* Skip dead monsters */
        if (!kill->r_idx)
            continue;

        /* Require current knowledge */
        if (kill->when < borg_t - 2)
            continue;

        /* Not in town.  This should not be reached, but just in case we add it
         */
        if (borg.trait[BI_CDEPTH] == 0)
            continue;

        /* no attacking most scaryguys, try to get off the level */
        if (scaryguy_on_level)
            return false;

        /* Get grid */
        ag = &borg_grids[kill->pos.y][kill->pos.x];

        /* Never shoot off-screen */
        if (!(ag->info & BORG_OKAY))
            continue;

        /* Never shoot through walls */
        if (!(ag->info & BORG_VIEW))
            continue;

        /* Check the distance XXX XXX XXX */
        if (distance(borg.c, kill->pos) != 1)
            continue;

        /* Save the location (careful) */
        borg_temp_x[borg_temp_n] = kill->pos.x;
        borg_temp_y[borg_temp_n] = kill->pos.y;
        borg_temp_n++;
    }

    /* No destinations */
    if (!borg_temp_n) {
        borg_attacking = false;
        return false;
    }

    /* Simulate */
    borg_simulate = true;

    /* Simulated */
    n = borg_calculate_attack_effectiveness(BF_THRUST);

    /* Nothing good */
    if (n <= 0) {
        borg_attacking = false;
        return false;
    }

    /* Note */
    borg_note(format("# Performing munchkin attack with value %d.", n));

    /* Instantiate */
    borg_simulate = false;

    /* Instantiate */
    (void)borg_calculate_attack_effectiveness(BF_THRUST);

    borg_attacking = false;

    /* Success */
    return true;
}